

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# savestream.cpp
# Opt level: O1

void __thiscall
signalInfo_t::addData(signalInfo_t *this,uint64_t ntpTimestamp,double *pValues,size_t count)

{
  ostream *poVar1;
  size_t sVar2;
  
  *(uint *)(&this->field_0x18 + *(long *)(*(long *)this + -0x18)) =
       *(uint *)(&this->field_0x18 + *(long *)(*(long *)this + -0x18)) & 0xffffffb5 | 8;
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)this);
  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  if (count != 0) {
    sVar2 = 0;
    do {
      poVar1 = std::ostream::_M_insert<double>(pValues[sVar2]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
      sVar2 = sVar2 + 1;
    } while (count != sVar2);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)this + -0x18) + (char)this);
  std::ostream::put((char)this);
  std::ostream::flush();
  this->dataFileNextLine = this->dataFileNextLine + 1;
  return;
}

Assistant:

void addData(uint64_t ntpTimestamp, const double* pValues, size_t count)
	{
		dataFile << std::hex << ntpTimestamp << std::dec << " ";
		for (size_t i=0; i<count; ++i) {
			dataFile << *pValues << " ";
			++pValues;
		}
		dataFile << std::endl;
		++dataFileNextLine;
	}